

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O0

Transform * __thiscall iDynTree::Axis::getRotationTransform(Axis *this,double theta)

{
  VectorFixSize<3U> *pVVar1;
  double *pdVar2;
  Transform *in_RSI;
  Transform *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Position translationPosition;
  double c;
  double b;
  double a;
  double w2;
  double w;
  double v2;
  double v;
  double u2;
  double u;
  double sint;
  double cost;
  Transform *nonRotated_T_rotated;
  Rotation *in_stack_fffffffffffffef8;
  VectorFixSize<3U> local_d0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double in_stack_ffffffffffffffb0;
  Direction *in_stack_ffffffffffffffb8;
  
  Transform::Transform(in_RSI);
  getDirection((Axis *)in_RSI);
  Rotation::RotAxis(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Transform::setRotation(in_RSI,in_stack_fffffffffffffef8);
  local_68 = cos(in_XMM0_Qa);
  local_70 = sin(in_XMM0_Qa);
  pVVar1 = &getDirection((Axis *)in_RSI)->super_Vector3;
  local_78 = VectorFixSize<3U>::operator()(pVVar1,0);
  local_80 = local_78 * local_78;
  pVVar1 = &getDirection((Axis *)in_RSI)->super_Vector3;
  local_88 = VectorFixSize<3U>::operator()(pVVar1,1);
  local_90 = local_88 * local_88;
  pVVar1 = &getDirection((Axis *)in_RSI)->super_Vector3;
  local_98 = VectorFixSize<3U>::operator()(pVVar1,2);
  local_a0 = local_98 * local_98;
  pVVar1 = &getOrigin((Axis *)in_RSI)->super_Vector3;
  local_a8 = VectorFixSize<3U>::operator()(pVVar1,0);
  pVVar1 = &getOrigin((Axis *)in_RSI)->super_Vector3;
  local_b0 = VectorFixSize<3U>::operator()(pVVar1,1);
  pVVar1 = &getOrigin((Axis *)in_RSI)->super_Vector3;
  local_b8 = VectorFixSize<3U>::operator()(pVVar1,2);
  Position::Position((Position *)0x626463);
  dVar4 = local_78 * (local_b0 * local_88 + local_b8 * local_98);
  dVar3 = local_a8 * (local_90 + local_a0);
  dVar6 = 1.0 - local_68;
  dVar5 = (local_b0 * local_98 + -(local_b8 * local_88)) * local_70;
  pdVar2 = VectorFixSize<3U>::operator()(&local_d0,0);
  *pdVar2 = (dVar3 + -dVar4) * dVar6 + dVar5;
  dVar4 = local_88 * (local_a8 * local_78 + local_b8 * local_98);
  dVar3 = local_b0 * (local_80 + local_a0);
  dVar6 = 1.0 - local_68;
  dVar5 = (local_b8 * local_78 + -(local_a8 * local_98)) * local_70;
  pdVar2 = VectorFixSize<3U>::operator()(&local_d0,1);
  *pdVar2 = (dVar3 + -dVar4) * dVar6 + dVar5;
  dVar4 = local_98 * (local_a8 * local_78 + local_b0 * local_88);
  dVar3 = local_b8 * (local_80 + local_90);
  dVar6 = 1.0 - local_68;
  dVar5 = (local_a8 * local_88 + -(local_b0 * local_78)) * local_70;
  pdVar2 = VectorFixSize<3U>::operator()(&local_d0,2);
  *pdVar2 = (dVar3 + -dVar4) * dVar6 + dVar5;
  Transform::setPosition(in_RSI,(Position *)in_stack_fffffffffffffef8);
  return in_RDI;
}

Assistant:

Transform Axis::getRotationTransform(const double theta) const
    {
        // Formula for rotation around and arbitrary axis given by
        // http://inside.mines.edu/fs_home/gmurray/ArbitraryAxisRotation/
        Transform nonRotated_T_rotated;

        // rotation
        nonRotated_T_rotated.setRotation(Rotation::RotAxis(this->getDirection(),theta));

        // translation
        double cost = cos(theta);
        double sint = sin(theta);
        double u   = this->getDirection()(0);
        double u2  = u*u;
        double v   = this->getDirection()(1);
        double v2  = v*v;
        double w   = this->getDirection()(2);
        double w2  = w*w;
        double a    = this->getOrigin()(0);
        double b    = this->getOrigin()(1);
        double c    = this->getOrigin()(2);

        Position translationPosition;
        translationPosition(0) =
            (a*(v2+w2) - u*(b*v+c*w))*(1-cost) + (b*w-c*v)*sint;
        translationPosition(1) =
            (b*(u2+w2) - v*(a*u+c*w))*(1-cost) + (c*u-a*w)*sint;
        translationPosition(2) =
            (c*(u2+v2) - w*(a*u+b*v))*(1-cost) + (a*v-b*u)*sint;

        nonRotated_T_rotated.setPosition(translationPosition);

        return nonRotated_T_rotated;
    }